

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  bool bVar1;
  uint32_t begin;
  PatchList end;
  Frag in_RSI;
  Inst *in_RDI;
  int unaff_retaddr;
  Compiler *in_stack_00000008;
  int id;
  uint32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  PatchList PStack_c;
  Frag local_8;
  
  bVar1 = IsNoMatch(in_RSI);
  if (bVar1) {
    local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    begin = AllocInst(in_stack_00000008,unaff_retaddr);
    if ((int)begin < 0) {
      local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      PODArray<re2::Prog::Inst>::operator[]
                ((PODArray<re2::Prog::Inst> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      Prog::Inst::InitCapture
                ((Inst *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      PODArray<re2::Prog::Inst>::operator[]
                ((PODArray<re2::Prog::Inst> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      Prog::Inst::InitCapture
                ((Inst *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x23ee62);
      PStack_c = in_RSI.end.p;
      PatchList::Patch(in_RDI,PStack_c,in_stack_ffffffffffffffc4);
      end = PatchList::Mk((begin + 1) * 2);
      Frag::Frag(&local_8,begin,end);
    }
  }
  return local_8;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1));
}